

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O0

bool Limonp::unicodeToUtf8(const_iterator begin,const_iterator end,string *res)

{
  bool bVar1;
  reference puVar2;
  string *in_RDX;
  uint16_t ui;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffffd0;
  int iVar3;
  undefined6 in_stack_ffffffffffffffd8;
  ushort uVar4;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_10;
  bool local_1;
  
  bVar1 = __gnu_cxx::operator>=
                    ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::__cxx11::string::clear();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffd0._M_current >> 0x20);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_10);
      uVar4 = *puVar2;
      if (uVar4 < 0x80) {
        std::__cxx11::string::operator+=(in_RDX,(char)uVar4);
      }
      else if (uVar4 < 0x800) {
        std::__cxx11::string::operator+=(in_RDX,(byte)((int)(uint)uVar4 >> 6) & 0x1f | 0xc0);
        std::__cxx11::string::operator+=(in_RDX,(byte)uVar4 & 0x3f | 0x80);
      }
      else {
        std::__cxx11::string::operator+=(in_RDX,(byte)((int)(uint)uVar4 >> 0xc) | 0xe0);
        std::__cxx11::string::operator+=(in_RDX,(byte)((int)(uint)uVar4 >> 6) & 0x3f | 0x80);
        std::__cxx11::string::operator+=(in_RDX,(byte)uVar4 & 0x3f | 0x80);
      }
      in_stack_ffffffffffffffd0 =
           __gnu_cxx::
           __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
           ::operator++((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                         *)CONCAT26(uVar4,in_stack_ffffffffffffffd8),iVar3);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool unicodeToUtf8(vector<uint16_t>::const_iterator begin, vector<uint16_t>::const_iterator end, string& res)
    {
        if(begin >= end)
        {
            return false;
        }
        res.clear();
        uint16_t ui;
        while(begin != end)
        {
            ui = *begin;
            if(ui <= 0x7f)
            {
                res += char(ui);
            }
            else if(ui <= 0x7ff)
            {
                res += char(((ui>>6) & 0x1f) | 0xc0);
                res += char((ui & 0x3f) | 0x80);
            }
            else
            {
                res += char(((ui >> 12) & 0x0f )| 0xe0);
                res += char(((ui>>6) & 0x3f )| 0x80 );
                res += char((ui & 0x3f) | 0x80);
            }
            begin ++;
        }
        return true;
    }